

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

bool __thiscall spvtools::opt::LoopPeelingPass::ProcessFunction(LoopPeelingPass *this,Function *f)

{
  Loop *loop_00;
  pointer this_00;
  byte bVar1;
  bool bVar2;
  IRContext *pIVar3;
  size_t __n;
  reference ppLVar4;
  Loop *pLVar5;
  Loop *still_peelable_loop;
  anon_class_24_3_ffa921fa try_peel;
  CodeMetrics loop_size;
  Loop *loop;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *__range2_1;
  ScalarEvolutionAnalysis scev_analysis;
  Loop *l;
  iterator __end2;
  iterator __begin2;
  LoopDescriptor *__range2;
  vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> to_process_loop;
  LoopDescriptor *loop_descriptor;
  Function *pFStack_18;
  bool modified;
  Function *f_local;
  LoopPeelingPass *this_local;
  
  loop_descriptor._7_1_ = 0;
  pFStack_18 = f;
  f_local = (Function *)this;
  pIVar3 = Pass::context(&this->super_Pass);
  to_process_loop.super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)IRContext::GetLoopDescriptor(pIVar3,pFStack_18);
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::vector
            ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)&__range2);
  __n = LoopDescriptor::NumLoops
                  ((LoopDescriptor *)
                   to_process_loop.
                   super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::reserve
            ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)&__range2,__n)
  ;
  this_00 = to_process_loop.
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  LoopDescriptor::begin
            ((iterator *)
             ((long)&__end2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18),
             (LoopDescriptor *)
             to_process_loop.
             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  LoopDescriptor::end((iterator *)&l,(LoopDescriptor *)this_00);
  while( true ) {
    bVar2 = PostOrderTreeDFIterator<spvtools::opt::Loop>::operator!=
                      ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
                       ((long)&__end2.parent_iterators_.c.
                               super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish + 0x18),
                       (PostOrderTreeDFIterator<spvtools::opt::Loop> *)&l);
    if (!bVar2) break;
    scev_analysis.pretend_equal_._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)PostOrderTreeDFIterator<spvtools::opt::Loop>::operator*
                           ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
                            ((long)&__end2.parent_iterators_.c.
                                    super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::push_back
              ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)&__range2,
               (value_type *)
               &scev_analysis.pretend_equal_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    PostOrderTreeDFIterator<spvtools::opt::Loop>::operator++
              ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
               ((long)&__end2.parent_iterators_.c.
                       super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  }
  PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator
            ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)&l);
  PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator
            ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
             ((long)&__end2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  pIVar3 = Pass::context(&this->super_Pass);
  ScalarEvolutionAnalysis::ScalarEvolutionAnalysis((ScalarEvolutionAnalysis *)&__range2_1,pIVar3);
  __end2_1 = std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::begin
                       ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)
                        &__range2);
  loop = (Loop *)std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::end
                           ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *
                            )&__range2);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
                        *)&loop);
    bVar1 = loop_descriptor._7_1_;
    if (!bVar2) break;
    ppLVar4 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
              ::operator*(&__end2_1);
    loop_00 = *ppLVar4;
    CodeMetrics::CodeMetrics((CodeMetrics *)&try_peel.this);
    CodeMetrics::Analyze((CodeMetrics *)&try_peel.this,loop_00);
    still_peelable_loop = (Loop *)&try_peel.this;
    try_peel.loop_size = (CodeMetrics *)((long)&loop_descriptor + 7);
    try_peel.modified = (bool *)this;
    pLVar5 = ProcessFunction::anon_class_24_3_ffa921fa::operator()
                       ((anon_class_24_3_ffa921fa *)&still_peelable_loop,loop_00);
    if (pLVar5 != (Loop *)0x0) {
      ProcessFunction::anon_class_24_3_ffa921fa::operator()
                ((anon_class_24_3_ffa921fa *)&still_peelable_loop,loop_00);
    }
    CodeMetrics::~CodeMetrics((CodeMetrics *)&try_peel.this);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
    ::operator++(&__end2_1);
  }
  ScalarEvolutionAnalysis::~ScalarEvolutionAnalysis((ScalarEvolutionAnalysis *)&__range2_1);
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::~vector
            ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)&__range2);
  return (bool)(bVar1 & 1);
}

Assistant:

bool LoopPeelingPass::ProcessFunction(Function* f) {
  bool modified = false;
  LoopDescriptor& loop_descriptor = *context()->GetLoopDescriptor(f);

  std::vector<Loop*> to_process_loop;
  to_process_loop.reserve(loop_descriptor.NumLoops());
  for (Loop& l : loop_descriptor) {
    to_process_loop.push_back(&l);
  }

  ScalarEvolutionAnalysis scev_analysis(context());

  for (Loop* loop : to_process_loop) {
    CodeMetrics loop_size;
    loop_size.Analyze(*loop);

    auto try_peel = [&loop_size, &modified, this](Loop* loop_to_peel) -> Loop* {
      if (!loop_to_peel->IsLCSSA()) {
        LoopUtils(context(), loop_to_peel).MakeLoopClosedSSA();
      }

      bool peeled_loop;
      Loop* still_peelable_loop;
      std::tie(peeled_loop, still_peelable_loop) =
          ProcessLoop(loop_to_peel, &loop_size);

      if (peeled_loop) {
        modified = true;
      }

      return still_peelable_loop;
    };

    Loop* still_peelable_loop = try_peel(loop);
    // The pass is working out the maximum factor by which a loop can be peeled.
    // If the loop can potentially be peeled again, then there is only one
    // possible direction, so only one call is still needed.
    if (still_peelable_loop) {
      try_peel(loop);
    }
  }

  return modified;
}